

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000197360 = 0x2d2d2d2d2d2d2d;
    uRam0000000000197367._0_1_ = '-';
    uRam0000000000197367._1_1_ = '-';
    uRam0000000000197367._2_1_ = '-';
    uRam0000000000197367._3_1_ = '-';
    uRam0000000000197367._4_1_ = '-';
    uRam0000000000197367._5_1_ = '-';
    uRam0000000000197367._6_1_ = '-';
    uRam0000000000197367._7_1_ = '-';
    DAT_00197350 = '-';
    DAT_00197350_1._0_1_ = '-';
    DAT_00197350_1._1_1_ = '-';
    DAT_00197350_1._2_1_ = '-';
    DAT_00197350_1._3_1_ = '-';
    DAT_00197350_1._4_1_ = '-';
    DAT_00197350_1._5_1_ = '-';
    DAT_00197350_1._6_1_ = '-';
    uRam0000000000197358 = 0x2d2d2d2d2d2d2d;
    DAT_0019735f = 0x2d;
    DAT_00197340 = '-';
    DAT_00197340_1._0_1_ = '-';
    DAT_00197340_1._1_1_ = '-';
    DAT_00197340_1._2_1_ = '-';
    DAT_00197340_1._3_1_ = '-';
    DAT_00197340_1._4_1_ = '-';
    DAT_00197340_1._5_1_ = '-';
    DAT_00197340_1._6_1_ = '-';
    uRam0000000000197348._0_1_ = '-';
    uRam0000000000197348._1_1_ = '-';
    uRam0000000000197348._2_1_ = '-';
    uRam0000000000197348._3_1_ = '-';
    uRam0000000000197348._4_1_ = '-';
    uRam0000000000197348._5_1_ = '-';
    uRam0000000000197348._6_1_ = '-';
    uRam0000000000197348._7_1_ = '-';
    DAT_00197330 = '-';
    DAT_00197330_1._0_1_ = '-';
    DAT_00197330_1._1_1_ = '-';
    DAT_00197330_1._2_1_ = '-';
    DAT_00197330_1._3_1_ = '-';
    DAT_00197330_1._4_1_ = '-';
    DAT_00197330_1._5_1_ = '-';
    DAT_00197330_1._6_1_ = '-';
    uRam0000000000197338._0_1_ = '-';
    uRam0000000000197338._1_1_ = '-';
    uRam0000000000197338._2_1_ = '-';
    uRam0000000000197338._3_1_ = '-';
    uRam0000000000197338._4_1_ = '-';
    uRam0000000000197338._5_1_ = '-';
    uRam0000000000197338._6_1_ = '-';
    uRam0000000000197338._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000197328._0_1_ = '-';
    uRam0000000000197328._1_1_ = '-';
    uRam0000000000197328._2_1_ = '-';
    uRam0000000000197328._3_1_ = '-';
    uRam0000000000197328._4_1_ = '-';
    uRam0000000000197328._5_1_ = '-';
    uRam0000000000197328._6_1_ = '-';
    uRam0000000000197328._7_1_ = '-';
    DAT_0019736f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}